

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LdConfigDirWrapper.h
# Opt level: O0

size_t __thiscall LdConfigDirWrapper::getFieldsCount(LdConfigDirWrapper *this)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  offset_t local_38;
  offset_t fieldDelta;
  size_t fId;
  bool is32b;
  offset_t realSize;
  LdConfigDirWrapper *this_local;
  
  iVar1 = (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
            super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xd])();
  iVar2 = (*(((this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
              super_ExeElementWrapper.m_Exe)->super_AbstractByteBuffer)._vptr_AbstractByteBuffer
            [0xb])();
  fieldDelta = 0x2e;
  local_38 = 0xffffffffffffffff;
  while ((fieldDelta != 0 &&
         (local_38 = _getFieldDelta((bool)(-(iVar2 == 0x20) & 1),fieldDelta),
         CONCAT44(extraout_var,iVar1) <= local_38))) {
    fieldDelta = fieldDelta - 1;
  }
  if ((local_38 == 0xffffffffffffffff) || (CONCAT44(extraout_var,iVar1) < local_38)) {
    this_local = (LdConfigDirWrapper *)0x0;
  }
  else {
    this_local = (LdConfigDirWrapper *)(fieldDelta + 1);
  }
  return (size_t)this_local;
}

Assistant:

virtual size_t getFieldsCount()
    {
        const offset_t realSize = getSize();
        const bool is32b = (m_Exe->getBitMode() == Executable::BITS_32) ? true : false;
        size_t fId = FIELD_COUNTER - 1;
        offset_t fieldDelta = INVALID_ADDR;
        for (; fId != 0; fId--) {
            fieldDelta = _getFieldDelta(is32b, fId);
            if (fieldDelta < realSize) break;
        }
        if ((fieldDelta == INVALID_ADDR) || (fieldDelta > realSize)) {
            return 0;
        }
        return (fId + 1);
    }